

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<int,bool,int>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,int *args,bool *args_1,
          int *args_2)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<int,bool,int>((ostream *)local_1b0,(char *)this,(int *)fmt,(bool *)args,(int *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}